

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O0

wchar_t archive_acl_add_entry_w_len
                  (archive_acl *acl,wchar_t type,wchar_t permset,wchar_t tag,wchar_t id,
                  wchar_t *name,size_t len)

{
  wchar_t wVar1;
  archive_acl_entry *aes;
  wchar_t in_ECX;
  wchar_t in_EDX;
  wchar_t in_ESI;
  archive_acl *in_RDI;
  wchar_t in_R8D;
  int *in_R9;
  archive_acl_entry *ap;
  wchar_t *in_stack_ffffffffffffffc8;
  undefined4 local_4;
  
  wVar1 = acl_special(in_RDI,in_ESI,in_EDX,in_ECX);
  if (wVar1 == L'\0') {
    local_4 = L'\0';
  }
  else {
    aes = acl_new_entry((archive_acl *)CONCAT44(in_ESI,in_EDX),in_ECX,in_R8D,
                        (wchar_t)((ulong)in_R9 >> 0x20),(wchar_t)in_R9);
    if (aes == (archive_acl_entry *)0x0) {
      local_4 = L'\xffffffe7';
    }
    else {
      if (((in_R9 == (int *)0x0) || (*in_R9 == 0)) || (ap == (archive_acl_entry *)0x0)) {
        archive_mstring_clean((archive_mstring *)0x192ebd);
      }
      else {
        archive_mstring_copy_wcs_len((archive_mstring *)aes,in_stack_ffffffffffffffc8,0x192ead);
      }
      local_4 = L'\0';
    }
  }
  return local_4;
}

Assistant:

int
archive_acl_add_entry_w_len(struct archive_acl *acl,
    int type, int permset, int tag, int id, const wchar_t *name, size_t len)
{
	struct archive_acl_entry *ap;

	if (acl_special(acl, type, permset, tag) == 0)
		return ARCHIVE_OK;
	ap = acl_new_entry(acl, type, permset, tag, id);
	if (ap == NULL) {
		/* XXX Error XXX */
		return ARCHIVE_FAILED;
	}
	if (name != NULL  &&  *name != L'\0' && len > 0)
		archive_mstring_copy_wcs_len(&ap->name, name, len);
	else
		archive_mstring_clean(&ap->name);
	return ARCHIVE_OK;
}